

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QWindowSystemInterface::TouchPoint>::reserve
          (QList<QWindowSystemInterface::TouchPoint> *this,qsizetype asize)

{
  bool bVar1;
  Int IVar2;
  QArrayDataPointer<QWindowSystemInterface::TouchPoint> *this_00;
  qsizetype qVar3;
  TouchPoint *e;
  TouchPoint *b;
  Data *pDVar4;
  long in_RSI;
  QArrayDataPointer<QWindowSystemInterface::TouchPoint> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QWindowSystemInterface::TouchPoint> *in_stack_ffffffffffffff78;
  QFlagsStorage<QArrayData::ArrayOption> f;
  QArrayDataPointer<QWindowSystemInterface::TouchPoint> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QWindowSystemInterface::TouchPoint> *in_stack_ffffffffffffff88;
  AllocationOption option;
  QGenericArrayOps<QWindowSystemInterface::TouchPoint> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  QArrayDataPointer<QWindowSystemInterface::TouchPoint> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QArrayDataPointer<QWindowSystemInterface::TouchPoint> *)
            capacity((QList<QWindowSystemInterface::TouchPoint> *)0x115b8f);
  qVar3 = QArrayDataPointer<QWindowSystemInterface::TouchPoint>::freeSpaceAtBegin
                    (in_stack_ffffffffffffff88);
  option = (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RSI <= (long)this_00 - qVar3) {
    QArrayDataPointer<QWindowSystemInterface::TouchPoint>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<QWindowSystemInterface::TouchPoint>::flags(in_stack_ffffffffffffff80);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,
                    (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    if (IVar2 != 0) goto LAB_00115d32;
    QArrayDataPointer<QWindowSystemInterface::TouchPoint>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QWindowSystemInterface::TouchPoint>::isShared
                      (in_stack_ffffffffffffff80);
    if (!bVar1) {
      QArrayDataPointer<QWindowSystemInterface::TouchPoint>::operator->(in_RDI);
      f.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,f.i);
      QArrayDataPointer<QWindowSystemInterface::TouchPoint>::setFlag
                ((QArrayDataPointer<QWindowSystemInterface::TouchPoint> *)0x115c36,(ArrayOptions)f.i
                );
      goto LAB_00115d32;
    }
  }
  local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.ptr = (TouchPoint *)0xaaaaaaaaaaaaaaaa;
  local_38.size = -0x5555555555555556;
  local_40 = size((QList<QWindowSystemInterface::TouchPoint> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  QArrayDataPointer<QWindowSystemInterface::TouchPoint>::QArrayDataPointer
            (this_00,(qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffff90,option);
  e = (TouchPoint *)QArrayDataPointer<QWindowSystemInterface::TouchPoint>::operator->(&local_38);
  QArrayDataPointer<QWindowSystemInterface::TouchPoint>::operator->(in_RDI);
  b = QArrayDataPointer<QWindowSystemInterface::TouchPoint>::begin
                ((QArrayDataPointer<QWindowSystemInterface::TouchPoint> *)0x115cb6);
  QArrayDataPointer<QWindowSystemInterface::TouchPoint>::operator->(in_RDI);
  QArrayDataPointer<QWindowSystemInterface::TouchPoint>::end
            ((QArrayDataPointer<QWindowSystemInterface::TouchPoint> *)e);
  QtPrivate::QGenericArrayOps<QWindowSystemInterface::TouchPoint>::copyAppend
            (in_stack_ffffffffffffff90,b,e);
  pDVar4 = QArrayDataPointer<QWindowSystemInterface::TouchPoint>::d_ptr(&local_38);
  if (pDVar4 != (Data *)0x0) {
    in_stack_ffffffffffffff78 =
         (QArrayDataPointer<QWindowSystemInterface::TouchPoint> *)
         QArrayDataPointer<QWindowSystemInterface::TouchPoint>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)e,
               (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<QWindowSystemInterface::TouchPoint>::setFlag
              ((QArrayDataPointer<QWindowSystemInterface::TouchPoint> *)0x115d19,
               (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)
               SUB84((ulong)in_stack_ffffffffffffff78 >> 0x20,0));
  }
  QArrayDataPointer<QWindowSystemInterface::TouchPoint>::swap
            ((QArrayDataPointer<QWindowSystemInterface::TouchPoint> *)e,in_stack_ffffffffffffff78);
  QArrayDataPointer<QWindowSystemInterface::TouchPoint>::~QArrayDataPointer
            ((QArrayDataPointer<QWindowSystemInterface::TouchPoint> *)e);
LAB_00115d32:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}